

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

lyxp_expr * lyxp_parse_expr(char *expr)

{
  bool bVar1;
  ushort uVar2;
  uint16_t uVar3;
  int iVar4;
  lyxp_expr *exp;
  LY_ERR *pLVar5;
  char *pcVar6;
  lyxp_token *plVar7;
  uint16_t *puVar8;
  uint8_t *puVar9;
  ushort **ppuVar10;
  uint8_t **ppuVar11;
  bool bVar12;
  lyxp_token local_2c;
  int prev_function_check;
  lyxp_token tok_type;
  uint16_t ncname_len;
  uint16_t tok_len;
  uint16_t parsed;
  lyxp_expr *ret;
  char *expr_local;
  
  tok_type._2_2_ = LYXP_TOKEN_NONE >> 0x10;
  bVar1 = false;
  exp = (lyxp_expr *)calloc(1,0x30);
  if (exp == (lyxp_expr *)0x0) {
    pLVar5 = ly_errno_location();
    *pLVar5 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxp_parse_expr");
  }
  else {
    pcVar6 = strdup(expr);
    exp->expr = pcVar6;
    if (exp->expr == (char *)0x0) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxp_parse_expr");
    }
    else {
      exp->used = 0;
      exp->size = 10;
      plVar7 = (lyxp_token *)malloc((ulong)exp->size << 2);
      exp->tokens = plVar7;
      if (exp->tokens == (lyxp_token *)0x0) {
        pLVar5 = ly_errno_location();
        *pLVar5 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxp_parse_expr");
      }
      else {
        puVar8 = (uint16_t *)malloc((ulong)exp->size << 1);
        exp->expr_pos = puVar8;
        if (exp->expr_pos == (uint16_t *)0x0) {
          pLVar5 = ly_errno_location();
          *pLVar5 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxp_parse_expr");
        }
        else {
          puVar9 = (uint8_t *)malloc((ulong)exp->size);
          exp->tok_len = puVar9;
          if (exp->tok_len == (uint8_t *)0x0) {
            pLVar5 = ly_errno_location();
            *pLVar5 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxp_parse_expr");
          }
          else {
            while( true ) {
              bVar12 = true;
              if (((expr[(ushort)tok_type._2_2_] != ' ') &&
                  (bVar12 = true, expr[(ushort)tok_type._2_2_] != '\t')) &&
                 (bVar12 = true, expr[(ushort)tok_type._2_2_] != '\n')) {
                bVar12 = expr[(ushort)tok_type._2_2_] == '\r';
              }
              if (!bVar12) break;
              tok_type._2_2_ = tok_type._2_2_ + 1;
            }
            do {
              if (expr[(ushort)tok_type._2_2_] == '(') {
                tok_type._0_2_ = LYXP_TOKEN_PAR1;
                local_2c = LYXP_TOKEN_PAR1;
                if (((bVar1) && (exp->used != 0)) &&
                   (exp->tokens[(int)(exp->used - 1)] == LYXP_TOKEN_NAMETEST)) {
                  if (((exp->tok_len[(int)(exp->used - 1)] == '\x04') &&
                      ((iVar4 = strncmp(expr + exp->expr_pos[(int)(exp->used - 1)],"node",4),
                       iVar4 == 0 ||
                       (iVar4 = strncmp(expr + exp->expr_pos[(int)(exp->used - 1)],"text",4),
                       iVar4 == 0)))) ||
                     ((exp->tok_len[(int)(exp->used - 1)] == '\a' &&
                      (iVar4 = strncmp(expr + exp->expr_pos[(int)(exp->used - 1)],"comment",7),
                      iVar4 == 0)))) {
                    exp->tokens[(int)(exp->used - 1)] = LYXP_TOKEN_NODETYPE;
                  }
                  else {
                    exp->tokens[(int)(exp->used - 1)] = LYXP_TOKEN_FUNCNAME;
                  }
                  bVar1 = false;
                }
              }
              else if (expr[(ushort)tok_type._2_2_] == ')') {
                tok_type._0_2_ = LYXP_TOKEN_PAR1;
                local_2c = LYXP_TOKEN_PAR2;
              }
              else if (expr[(ushort)tok_type._2_2_] == '[') {
                tok_type._0_2_ = LYXP_TOKEN_PAR1;
                local_2c = LYXP_TOKEN_BRACK1;
              }
              else if (expr[(ushort)tok_type._2_2_] == ']') {
                tok_type._0_2_ = LYXP_TOKEN_PAR1;
                local_2c = LYXP_TOKEN_BRACK2;
              }
              else {
                iVar4 = strncmp(expr + (ushort)tok_type._2_2_,"..",2);
                if (iVar4 == 0) {
                  tok_type._0_2_ = LYXP_TOKEN_PAR2;
                  local_2c = LYXP_TOKEN_DDOT;
                }
                else if ((expr[(ushort)tok_type._2_2_] == '.') &&
                        (ppuVar10 = __ctype_b_loc(),
                        ((*ppuVar10)[(int)expr[(int)((ushort)tok_type._2_2_ + 1)]] & 0x800) == 0)) {
                  tok_type._0_2_ = LYXP_TOKEN_PAR1;
                  local_2c = LYXP_TOKEN_DOT;
                }
                else if (expr[(ushort)tok_type._2_2_] == '@') {
                  tok_type._0_2_ = LYXP_TOKEN_PAR1;
                  local_2c = LYXP_TOKEN_AT;
                }
                else if (expr[(ushort)tok_type._2_2_] == ',') {
                  tok_type._0_2_ = LYXP_TOKEN_PAR1;
                  local_2c = LYXP_TOKEN_COMMA;
                }
                else if (expr[(ushort)tok_type._2_2_] == '\'') {
                  tok_type._0_2_ = LYXP_TOKEN_PAR1;
                  while (expr[(int)((uint)(ushort)tok_type._2_2_ +
                                   (uint)(ushort)(undefined2)tok_type)] != '\'') {
                    tok_type._0_2_ = (undefined2)tok_type + LYXP_TOKEN_PAR1;
                  }
                  tok_type._0_2_ = (undefined2)tok_type + LYXP_TOKEN_PAR1;
                  local_2c = LYXP_TOKEN_LITERAL;
                }
                else if (expr[(ushort)tok_type._2_2_] == '\"') {
                  tok_type._0_2_ = LYXP_TOKEN_PAR1;
                  while (expr[(int)((uint)(ushort)tok_type._2_2_ +
                                   (uint)(ushort)(undefined2)tok_type)] != '\"') {
                    tok_type._0_2_ = (undefined2)tok_type + LYXP_TOKEN_PAR1;
                  }
                  tok_type._0_2_ = (undefined2)tok_type + LYXP_TOKEN_PAR1;
                  local_2c = LYXP_TOKEN_LITERAL;
                }
                else if ((expr[(ushort)tok_type._2_2_] == '.') ||
                        (ppuVar10 = __ctype_b_loc(),
                        ((*ppuVar10)[(int)expr[(ushort)tok_type._2_2_]] & 0x800) != 0)) {
                  tok_type._0_2_ = LYXP_TOKEN_NONE;
                  while (ppuVar10 = __ctype_b_loc(),
                        ((*ppuVar10)
                         [(int)expr[(int)((uint)(ushort)tok_type._2_2_ +
                                         (uint)(ushort)(undefined2)tok_type)]] & 0x800) != 0) {
                    tok_type._0_2_ = (undefined2)tok_type + LYXP_TOKEN_PAR1;
                  }
                  if (expr[(int)((uint)(ushort)tok_type._2_2_ + (uint)(ushort)(undefined2)tok_type)]
                      == '.') {
                    do {
                      tok_type._0_2_ = (undefined2)tok_type + LYXP_TOKEN_PAR1;
                      ppuVar10 = __ctype_b_loc();
                    } while (((*ppuVar10)
                              [(int)expr[(int)((uint)(ushort)tok_type._2_2_ +
                                              (uint)(ushort)(undefined2)tok_type)]] & 0x800) != 0);
                  }
                  local_2c = LYXP_TOKEN_NUMBER;
                }
                else if (expr[(ushort)tok_type._2_2_] == '/') {
                  iVar4 = strncmp(expr + (ushort)tok_type._2_2_,"//",2);
                  if (iVar4 == 0) {
                    tok_type._0_2_ = LYXP_TOKEN_PAR2;
                  }
                  else {
                    tok_type._0_2_ = LYXP_TOKEN_PAR1;
                  }
                  local_2c = LYXP_TOKEN_OPERATOR_PATH;
                }
                else {
                  iVar4 = strncmp(expr + (ushort)tok_type._2_2_,"!=",2);
                  if (((iVar4 == 0) ||
                      (iVar4 = strncmp(expr + (ushort)tok_type._2_2_,"<=",2), iVar4 == 0)) ||
                     (iVar4 = strncmp(expr + (ushort)tok_type._2_2_,">=",2), iVar4 == 0)) {
                    tok_type._0_2_ = LYXP_TOKEN_PAR2;
                    local_2c = LYXP_TOKEN_OPERATOR_COMP;
                  }
                  else if (expr[(ushort)tok_type._2_2_] == '|') {
                    tok_type._0_2_ = LYXP_TOKEN_PAR1;
                    local_2c = LYXP_TOKEN_OPERATOR_UNI;
                  }
                  else if ((expr[(ushort)tok_type._2_2_] == '+') ||
                          (expr[(ushort)tok_type._2_2_] == '-')) {
                    tok_type._0_2_ = LYXP_TOKEN_PAR1;
                    local_2c = LYXP_TOKEN_OPERATOR_MATH;
                  }
                  else if (((expr[(ushort)tok_type._2_2_] == '=') ||
                           (expr[(ushort)tok_type._2_2_] == '<')) ||
                          (expr[(ushort)tok_type._2_2_] == '>')) {
                    tok_type._0_2_ = LYXP_TOKEN_PAR1;
                    local_2c = LYXP_TOKEN_OPERATOR_COMP;
                  }
                  else if (((((((exp->used == 0) ||
                               (exp->tokens[(int)(exp->used - 1)] == LYXP_TOKEN_AT)) ||
                              (exp->tokens[(int)(exp->used - 1)] == LYXP_TOKEN_PAR1)) ||
                             ((exp->tokens[(int)(exp->used - 1)] == LYXP_TOKEN_BRACK1 ||
                              (exp->tokens[(int)(exp->used - 1)] == LYXP_TOKEN_COMMA)))) ||
                            ((exp->tokens[(int)(exp->used - 1)] == LYXP_TOKEN_OPERATOR_LOG ||
                             ((exp->tokens[(int)(exp->used - 1)] == LYXP_TOKEN_OPERATOR_COMP ||
                              (exp->tokens[(int)(exp->used - 1)] == LYXP_TOKEN_OPERATOR_MATH))))))
                           || (exp->tokens[(int)(exp->used - 1)] == LYXP_TOKEN_OPERATOR_UNI)) ||
                          (exp->tokens[(int)(exp->used - 1)] == LYXP_TOKEN_OPERATOR_PATH)) {
                    if (expr[(ushort)tok_type._2_2_] == '*') {
                      tok_type._0_2_ = LYXP_TOKEN_PAR1;
                    }
                    else {
                      tok_type._0_2_ = parse_ncname(expr + (ushort)tok_type._2_2_);
                      if ((undefined2)tok_type == LYXP_TOKEN_NONE) {
                        ly_vlog(LYE_INCHAR,LY_VLOG_NONE,(void *)0x0,
                                (ulong)(uint)(int)expr[(ushort)tok_type._2_2_],
                                expr + (ushort)tok_type._2_2_);
                        goto LAB_0019668c;
                      }
                      if (expr[(int)((uint)(ushort)tok_type._2_2_ +
                                    (uint)(ushort)(undefined2)tok_type)] == ':') {
                        uVar2 = (undefined2)tok_type + LYXP_TOKEN_PAR1;
                        if (expr[(int)((uint)(ushort)tok_type._2_2_ + (uint)uVar2)] == '*') {
                          tok_type._0_2_ = (undefined2)tok_type + LYXP_TOKEN_PAR2;
                        }
                        else {
                          uVar3 = parse_ncname(expr + (int)((uint)(ushort)tok_type._2_2_ +
                                                           (uint)uVar2));
                          if (uVar3 == 0) {
                            ly_vlog(LYE_INCHAR,LY_VLOG_NONE,(void *)0x0,
                                    (ulong)(uint)(int)expr[(ushort)tok_type._2_2_],
                                    expr + (ushort)tok_type._2_2_);
                            goto LAB_0019668c;
                          }
                          tok_type._0_2_ = uVar2 + uVar3;
                        }
                        bVar1 = false;
                      }
                      else {
                        bVar1 = true;
                      }
                    }
                    local_2c = LYXP_TOKEN_NAMETEST;
                  }
                  else if (expr[(ushort)tok_type._2_2_] == '*') {
                    tok_type._0_2_ = LYXP_TOKEN_PAR1;
                    local_2c = LYXP_TOKEN_OPERATOR_MATH;
                  }
                  else {
                    iVar4 = strncmp(expr + (ushort)tok_type._2_2_,"or",2);
                    if (iVar4 == 0) {
                      tok_type._0_2_ = LYXP_TOKEN_PAR2;
                      local_2c = LYXP_TOKEN_OPERATOR_LOG;
                    }
                    else {
                      iVar4 = strncmp(expr + (ushort)tok_type._2_2_,"and",3);
                      if (iVar4 == 0) {
                        local_2c = LYXP_TOKEN_OPERATOR_LOG;
                      }
                      else {
                        iVar4 = strncmp(expr + (ushort)tok_type._2_2_,"mod",3);
                        if ((iVar4 != 0) &&
                           (iVar4 = strncmp(expr + (ushort)tok_type._2_2_,"div",3), iVar4 != 0)) {
                          ly_vlog(LYE_INCHAR,LY_VLOG_NONE,(void *)0x0,
                                  (ulong)(uint)(int)expr[(ushort)tok_type._2_2_],
                                  expr + (ushort)tok_type._2_2_);
                          goto LAB_0019668c;
                        }
                        local_2c = LYXP_TOKEN_OPERATOR_MATH;
                      }
                      tok_type._0_2_ = LYXP_TOKEN_BRACK1;
                    }
                  }
                }
              }
              exp_add_token(exp,local_2c,tok_type._2_2_,(undefined2)tok_type);
              tok_type._2_2_ = tok_type._2_2_ + (undefined2)tok_type;
              while( true ) {
                bVar12 = true;
                if (((expr[(ushort)tok_type._2_2_] != ' ') &&
                    (bVar12 = true, expr[(ushort)tok_type._2_2_] != '\t')) &&
                   (bVar12 = true, expr[(ushort)tok_type._2_2_] != '\n')) {
                  bVar12 = expr[(ushort)tok_type._2_2_] == '\r';
                }
                if (!bVar12) break;
                tok_type._2_2_ = tok_type._2_2_ + 1;
              }
            } while (expr[(ushort)tok_type._2_2_] != '\0');
            ppuVar11 = (uint8_t **)calloc((ulong)exp->size,8);
            exp->repeat = ppuVar11;
            if (exp->repeat != (uint8_t **)0x0) {
              return exp;
            }
            pLVar5 = ly_errno_location();
            *pLVar5 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxp_parse_expr");
          }
        }
      }
    }
  }
LAB_0019668c:
  lyxp_expr_free(exp);
  return (lyxp_expr *)0x0;
}

Assistant:

struct lyxp_expr *
lyxp_parse_expr(const char *expr)
{
    struct lyxp_expr *ret;
    uint16_t parsed = 0, tok_len, ncname_len;
    enum lyxp_token tok_type;
    int prev_function_check = 0;

    /* init lyxp_expr structure */
    ret = calloc(1, sizeof *ret);
    if (!ret) {
        LOGMEM;
        goto error;
    }
    ret->expr = strdup(expr);
    if (!ret->expr) {
        LOGMEM;
        goto error;
    }
    ret->used = 0;
    ret->size = LYXP_EXPR_SIZE_START;
    ret->tokens = malloc(ret->size * sizeof *ret->tokens);
    if (!ret->tokens) {
        LOGMEM;
        goto error;
    }
    ret->expr_pos = malloc(ret->size * sizeof *ret->expr_pos);
    if (!ret->expr_pos) {
        LOGMEM;
        goto error;
    }
    ret->tok_len = malloc(ret->size * sizeof *ret->tok_len);
    if (!ret->tok_len) {
        LOGMEM;
        goto error;
    }

    while (is_xmlws(expr[parsed])) {
        ++parsed;
    }

    do {
        if (expr[parsed] == '(') {

            /* '(' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR1;

            if (prev_function_check && ret->used && (ret->tokens[ret->used - 1] == LYXP_TOKEN_NAMETEST)) {
                /* it is a NodeType/FunctionName after all */
                if (((ret->tok_len[ret->used - 1] == 4)
                        && (!strncmp(&expr[ret->expr_pos[ret->used - 1]], "node", 4)
                        || !strncmp(&expr[ret->expr_pos[ret->used - 1]], "text", 4))) ||
                        ((ret->tok_len[ret->used - 1] == 7)
                        && !strncmp(&expr[ret->expr_pos[ret->used - 1]], "comment", 7))) {
                    ret->tokens[ret->used - 1] = LYXP_TOKEN_NODETYPE;
                } else {
                    ret->tokens[ret->used - 1] = LYXP_TOKEN_FUNCNAME;
                }
                prev_function_check = 0;
            }

        } else if (expr[parsed] == ')') {

            /* ')' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR2;

        } else if (expr[parsed] == '[') {

            /* '[' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK1;

        } else if (expr[parsed] == ']') {

            /* ']' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK2;

        } else if (!strncmp(&expr[parsed], "..", 2)) {

            /* '..' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_DDOT;

        } else if ((expr[parsed] == '.') && (!isdigit(expr[parsed+1]))) {

            /* '.' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_DOT;

        } else if (expr[parsed] == '@') {

            /* '@' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_AT;

        } else if (expr[parsed] == ',') {

            /* ',' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_COMMA;

        } else if (expr[parsed] == '\'') {

            /* Literal with ' */
            for (tok_len = 1; expr[parsed + tok_len] != '\''; ++tok_len);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if (expr[parsed] == '\"') {

            /* Literal with " */
            for (tok_len = 1; expr[parsed + tok_len] != '\"'; ++tok_len);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if ((expr[parsed] == '.') || (isdigit(expr[parsed]))) {

            /* Number */
            for (tok_len = 0; isdigit(expr[parsed + tok_len]); ++tok_len);
            if (expr[parsed + tok_len] == '.') {
                ++tok_len;
                for (; isdigit(expr[parsed + tok_len]); ++tok_len);
            }
            tok_type = LYXP_TOKEN_NUMBER;

        } else if (expr[parsed] == '/') {

            /* Operator '/', '//' */
            if (!strncmp(&expr[parsed], "//", 2)) {
                tok_len = 2;
            } else {
                tok_len = 1;
            }
            tok_type = LYXP_TOKEN_OPERATOR_PATH;

        } else if  (!strncmp(&expr[parsed], "!=", 2) || !strncmp(&expr[parsed], "<=", 2)
                || !strncmp(&expr[parsed], ">=", 2)) {

            /* Operator '!=', '<=', '>=' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_OPERATOR_COMP;

        } else if (expr[parsed] == '|') {

            /* Operator '|' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPERATOR_UNI;

        } else if ((expr[parsed] == '+') || (expr[parsed] == '-')) {

            /* Operator '+', '-' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPERATOR_MATH;

        } else if ((expr[parsed] == '=') || (expr[parsed] == '<') || (expr[parsed] == '>')) {

            /* Operator '=', '<', '>' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPERATOR_COMP;

        } else if (ret->used && (ret->tokens[ret->used - 1] != LYXP_TOKEN_AT)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_PAR1)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_BRACK1)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_COMMA)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_LOG)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_COMP)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_MATH)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_UNI)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_PATH)) {

            /* Operator '*', 'or', 'and', 'mod', or 'div' */
            if (expr[parsed] == '*') {
                tok_len = 1;
                tok_type = LYXP_TOKEN_OPERATOR_MATH;

            } else if (!strncmp(&expr[parsed], "or", 2)) {
                tok_len = 2;
                tok_type = LYXP_TOKEN_OPERATOR_LOG;

            } else if (!strncmp(&expr[parsed], "and", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPERATOR_LOG;

            } else if (!strncmp(&expr[parsed], "mod", 3) || !strncmp(&expr[parsed], "div", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPERATOR_MATH;

            } else {
                LOGVAL(LYE_INCHAR, LY_VLOG_NONE, NULL, expr[parsed], &expr[parsed]);
                goto error;
            }
        } else if (expr[parsed] == '*') {

            /* NameTest '*' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_NAMETEST;

        } else {

            /* NameTest (NCName ':' '*' | QName) or NodeType/FunctionName */
            ncname_len = parse_ncname(&expr[parsed]);
            if (!ncname_len) {
                LOGVAL(LYE_INCHAR, LY_VLOG_NONE, NULL, expr[parsed], &expr[parsed]);
                goto error;
            }
            tok_len = ncname_len;

            if (expr[parsed + tok_len] == ':') {
                ++tok_len;
                if (expr[parsed + tok_len] == '*') {
                    ++tok_len;
                } else {
                    ncname_len = parse_ncname(&expr[parsed + tok_len]);
                    if (!ncname_len) {
                        LOGVAL(LYE_INCHAR, LY_VLOG_NONE, NULL, expr[parsed], &expr[parsed]);
                        goto error;
                    }
                    tok_len += ncname_len;
                }
                /* remove old flag to prevent ambiguities */
                prev_function_check = 0;
                tok_type = LYXP_TOKEN_NAMETEST;
            } else {
                /* there is no prefix so it can still be NodeType/FunctioName, we can't finally decide now */
                prev_function_check = 1;
                tok_type = LYXP_TOKEN_NAMETEST;
            }
        }

        /* store the token, move on to the next one */
        exp_add_token(ret, tok_type, parsed, tok_len);
        parsed += tok_len;
        while (is_xmlws(expr[parsed])) {
            ++parsed;
        }

    } while (expr[parsed]);

    /* prealloc repeat */
    ret->repeat = calloc(ret->size, sizeof *ret->repeat);
    if (!ret->repeat) {
        LOGMEM;
        goto error;
    }

    return ret;

error:
    lyxp_expr_free(ret);
    return NULL;
}